

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_convolve_test.cc
# Opt level: O0

uint8_t * __thiscall
anon_unknown.dwarf_e304c3::
AV1ConvolveTest<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>
::RandomInput8(AV1ConvolveTest<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>
               *this,uint8_t *p,
              TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>
              *param)

{
  bool bVar1;
  int iVar2;
  BlockSize *pBVar3;
  TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>
  *in_RDX;
  long in_RSI;
  AV1ConvolveTest<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>
  *in_RDI;
  int padded_height;
  int padded_width;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertHelper *in_stack_ffffffffffffff40;
  int size;
  int *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  char *in_stack_ffffffffffffff60;
  Type in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  undefined4 uVar4;
  AssertionResult local_88 [2];
  int local_68;
  undefined4 local_64;
  AssertionResult local_60;
  Message *in_stack_ffffffffffffffb8;
  AssertHelper *in_stack_ffffffffffffffc0;
  AssertionResult local_28;
  TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>
  *local_18;
  long local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>
  ::BitDepth(in_RDX);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),(char *)in_RDI,
             in_stack_ffffffffffffff48,(int *)in_stack_ffffffffffffff40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    in_stack_ffffffffffffff48 =
         (int *)testing::AssertionResult::failure_message((AssertionResult *)0x943f6a);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               in_stack_ffffffffffffff6c,in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
               (char *)in_RDI);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffff40);
    testing::Message::~Message((Message *)0x943fbe);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x944029);
  local_64 = 0x80;
  pBVar3 = TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>
           ::Block(local_18);
  local_68 = BlockSize::Width(pBVar3);
  testing::internal::CmpHelperGE<int,int>
            ((char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),(char *)in_RDI,
             in_stack_ffffffffffffff48,(int *)in_stack_ffffffffffffff40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_60);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    in_stack_ffffffffffffff40 =
         (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x9440a9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               in_stack_ffffffffffffff6c,in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
               (char *)in_RDI);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffff40);
    testing::Message::~Message((Message *)0x9440f7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x94415c);
  uVar4 = 0x80;
  pBVar3 = TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>
           ::Block(local_18);
  iVar2 = BlockSize::Height(pBVar3);
  testing::internal::CmpHelperGE<int,int>
            ((char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),(char *)in_RDI,
             in_stack_ffffffffffffff48,(int *)in_stack_ffffffffffffff40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_88);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT44(uVar4,iVar2));
    testing::AssertionResult::failure_message((AssertionResult *)0x9441d9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(uVar4,iVar2),in_stack_ffffffffffffff6c,
               in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,(char *)in_RDI);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffff40);
    testing::Message::~Message((Message *)0x944225);
  }
  size = (int)((ulong)in_stack_ffffffffffffff40 >> 0x20);
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x94428a);
  pBVar3 = TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>
           ::Block(local_18);
  iVar2 = BlockSize::Width(pBVar3);
  iVar2 = iVar2 + 0xc;
  pBVar3 = TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>
           ::Block(local_18);
  BlockSize::Height(pBVar3);
  Randomize(in_RDI,(uint8_t *)in_stack_ffffffffffffff48,size);
  return (uint8_t *)(local_10 + iVar2 * 6 + 6);
}

Assistant:

const uint8_t *RandomInput8(uint8_t *p, const TestParam<T> &param) {
    EXPECT_EQ(8, param.BitDepth());
    EXPECT_GE(MAX_SB_SIZE, param.Block().Width());
    EXPECT_GE(MAX_SB_SIZE, param.Block().Height());
    const int padded_width = param.Block().Width() + kInputPadding;
    const int padded_height = param.Block().Height() + kInputPadding;
    Randomize(p, padded_width * padded_height);
    return p + (kInputPadding / 2) * padded_width + kInputPadding / 2;
  }